

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ConfigureXmlOutput(UnitTestImpl *this)

{
  bool bVar1;
  XmlUnitTestResultPrinter *this_00;
  char *output_file;
  ostream *poVar2;
  UnitTestImpl *in_RDI;
  string *output_format;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  TestEventListener *in_stack_ffffffffffffff18;
  TestEventListeners *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff48;
  JsonUnitTestResultPrinter *in_stack_ffffffffffffff50;
  GTestLog local_90;
  undefined1 local_89;
  string local_88 [4];
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  GTestLogSeverity in_stack_ffffffffffffff8c;
  GTestLog *in_stack_ffffffffffffff90;
  string local_60 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  UnitTestOptions::GetOutputFormat_abi_cxx11_();
  local_10 = local_30;
  bVar1 = std::operator==(local_30,"xml");
  if (bVar1) {
    this_00 = (XmlUnitTestResultPrinter *)listeners(in_RDI);
    output_file = (char *)operator_new(0x28);
    UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
    std::__cxx11::string::c_str();
    XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(this_00,output_file);
    TestEventListeners::SetDefaultXmlGenerator(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::__cxx11::string::~string(local_60);
  }
  else {
    bVar1 = std::operator==(local_10,"json");
    if (bVar1) {
      listeners(in_RDI);
      operator_new(0x28);
      local_89 = 1;
      UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_();
      std::__cxx11::string::c_str();
      JsonUnitTestResultPrinter::JsonUnitTestResultPrinter
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      local_89 = 0;
      TestEventListeners::SetDefaultXmlGenerator
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      std::__cxx11::string::~string(local_88);
    }
    else {
      bVar1 = std::operator!=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      if (bVar1) {
        GTestLog::GTestLog(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                           in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        poVar2 = GTestLog::GetStream(&local_90);
        poVar2 = std::operator<<(poVar2,"WARNING: unrecognized output format \"");
        poVar2 = std::operator<<(poVar2,(string *)local_10);
        std::operator<<(poVar2,"\" ignored.");
        GTestLog::~GTestLog((GTestLog *)poVar2);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void UnitTestImpl::ConfigureXmlOutput() {
  const std::string& output_format = UnitTestOptions::GetOutputFormat();
  if (output_format == "xml") {
    listeners()->SetDefaultXmlGenerator(new XmlUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (output_format == "json") {
    listeners()->SetDefaultXmlGenerator(new JsonUnitTestResultPrinter(
        UnitTestOptions::GetAbsolutePathToOutputFile().c_str()));
  } else if (output_format != "") {
    GTEST_LOG_(WARNING) << "WARNING: unrecognized output format \""
                        << output_format << "\" ignored.";
  }
}